

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

ResetPtr __thiscall libcellml::Component::takeReset(Component *this,size_t index)

{
  undefined8 *puVar1;
  long lVar2;
  ResetImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ResetPtr RVar3;
  
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)0x0;
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
       (EntityImpl *)0x0;
  lVar2 = *(long *)(*(long *)(index + 8) + 0xb0);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(*(long *)(index + 8) + 0xb8) - lVar2 >> 4)) {
    puVar1 = (undefined8 *)(lVar2 + (long)in_RDX._M_pi * 0x10);
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
         (_func_int **)*puVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1));
    removeReset((Component *)index,(size_t)in_RDX._M_pi);
    this_00 = Reset::pFunc((Reset *)(this->super_ComponentEntity).super_NamedEntity.
                                    super_ParentedEntity.super_Entity._vptr_Entity);
    ParentedEntity::ParentedEntityImpl::removeParent(&this_00->super_ParentedEntityImpl);
    in_RDX._M_pi = extraout_RDX;
  }
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr Component::takeReset(size_t index)
{
    ResetPtr reset = nullptr;
    if (index < pFunc()->mResets.size()) {
        reset = pFunc()->mResets.at(index);
        removeReset(index);
        reset->pFunc()->removeParent();
    }

    return reset;
}